

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O2

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_4835::LoadEgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  int halfnibble;
  int iVar8;
  ulong uVar9;
  pointer pIVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  allocator_type local_91;
  vector<Image,_std::allocator<Image>_> *local_90;
  ulong local_88;
  Image local_50;
  
  uVar13 = (ulong)((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start) >> 8;
  Image::Image(&local_50,0xf,0xf);
  local_90 = __return_storage_ptr__;
  local_88 = uVar13;
  std::vector<Image,_std::allocator<Image>_>::vector
            (__return_storage_ptr__,uVar13,&local_50,&local_91);
  std::_Vector_base<color_t,_std::allocator<color_t>_>::~_Vector_base
            (&local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>);
  for (uVar13 = 0; uVar13 != local_88; uVar13 = uVar13 + 1) {
    pIVar10 = (local_90->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
              super__Vector_impl_data._M_start + uVar13;
    for (lVar5 = 0; lVar5 != 0xf; lVar5 = lVar5 + 1) {
      uVar7 = lVar5 << 4 | (ulong)(uint)((int)uVar13 << 8);
      lVar12 = 0;
      for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
        bVar6 = 6;
        lVar11 = lVar12;
        for (iVar8 = 3; -1 < iVar8; iVar8 = iVar8 + -1) {
          if ((uint)lVar11 < 0xf) {
            puVar1 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar4 = (ulong)((puVar1[uVar9 + uVar7 + 0xc] >> (bVar6 & 0x1f) & 2 |
                            (byte)((puVar1[(uVar9 | uVar7) + 0x10] >> (bVar6 & 0x1f)) >> 1) & 1) +
                            (puVar1[uVar9 + 8 + uVar7] >> (bVar6 & 0x1f) & 2) * 2 +
                           (puVar1[uVar9 + 4 + uVar7] >> (bVar6 & 0x1f) & 2) * 4) * 3;
            lVar2 = *(long *)&(pIVar10->pixels_).
                              super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                              super__Vector_impl_data;
            lVar3 = ((long)pIVar10->width_ * (long)(int)lVar5 + lVar11) * 3;
            *(undefined1 *)(lVar2 + 2 + lVar3) = (anonymous_namespace)::ega_palette[lVar4 + 2];
            *(undefined2 *)(lVar2 + lVar3) =
                 *(undefined2 *)((anonymous_namespace)::ega_palette + lVar4);
          }
          bVar6 = bVar6 - 2;
          lVar11 = lVar11 + 1;
        }
        lVar12 = lVar12 + 4;
      }
    }
  }
  return local_90;
}

Assistant:

std::vector<Image> LoadEgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images,
                            Image(kImageWidth, kImageHeight));  // TODO 15x15

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    for (auto y = 0; y < kCellHeight - 1; ++y) {
      for (auto byte_column = 0; byte_column < kCgaBytesPerRow; ++byte_column) {
        auto const byte_offset =
            image_offset + (y * kEgaBytesPerRow) + byte_column;
        auto const next_byte_offset = byte_offset + kEgaBytesPerRow;

        for (auto halfnibble = 3; halfnibble >= 0; --halfnibble) {
          // + kCgaBytesPerRow * X    to "stride" rows
          // HalfNibble               to address a specific pixel
          // / 2                      to convert data half-nibble to bit
          // << Y                     to place bit in proper EGA index
          auto const ega = ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 1],
                                        halfnibble) /
                             2)
                            << 0x3) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 2],
                                        halfnibble) /
                             2)
                            << 0x2) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 3],
                                        halfnibble) /
                             2)
                            << 0x1) |
                           (HalfNibble(data[next_byte_offset], halfnibble) / 2);

          // Last byte of row only contains 3 pixels (because final image
          // is 15 wide, not 16 wide)
          auto const x = byte_column * kCgaBytesPerRow + (3 - halfnibble);
          if (x < kImageWidth) {
            image.Set(x, y, ega_palette[ega]);
          }
        }
      }
    }
  }

  return images;
}